

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               out,comm *comm)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  blk_dist part;
  unsigned_long local_98;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  blk_dist_buf local_60;
  
  if (comm->m_size == 1) {
    std::
    __copy_move_a<false,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (begin,end,out);
    return;
  }
  local_98 = (long)end._M_current - (long)begin._M_current >> 3;
  uVar3 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_98,comm);
  if (uVar3 != 0) {
    bVar1 = any_of(local_98 == uVar3,comm);
    if (bVar1) {
      impl::
      distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                (begin,end,out,uVar3,comm);
    }
    else {
      uVar4 = exscan<unsigned_long>(&local_98,comm);
      local_60.super_dist_base.m_comm_size = 0;
      local_60.super_dist_base.m_comm_rank = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
                 (long)comm->m_size,(value_type_conflict2 *)&local_60,(allocator_type *)&local_78);
      blk_dist_buf::blk_dist_buf(&local_60,uVar3,comm);
      if (local_98 != 0) {
        if (uVar4 < local_60.div1mod) {
          iVar2 = (int)(uVar4 / (local_60.div + 1));
        }
        else {
          iVar2 = (int)((uVar4 - local_60.div1mod) / local_60.div) + (int)local_60.mod;
        }
        uVar5 = (long)iVar2;
        uVar3 = local_98;
        while ((uVar3 != 0 && ((long)uVar5 < (long)comm->m_size))) {
          uVar6 = uVar5 + 1 & 0xffffffff;
          uVar7 = uVar6;
          if (local_60.mod < uVar6) {
            uVar7 = local_60.mod;
          }
          uVar7 = (local_60.div * uVar6 - uVar4) + uVar7;
          if (uVar3 < uVar7) {
            uVar7 = uVar3;
          }
          local_90._M_impl.super__Vector_impl_data._M_start[uVar5] = uVar7;
          uVar3 = uVar3 - uVar7;
          uVar4 = uVar4 + uVar7;
          uVar5 = uVar5 + 1;
        }
      }
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,comm);
      if (local_98 == 0) {
        begin._M_current = (pair<int,_int> *)0x0;
      }
      if (local_60.m_local_size == 0) {
        out._M_current = (pair<int,_int> *)0x0;
      }
      all2allv<std::pair<int,int>>
                (begin._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90
                 ,out._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                 comm);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_90);
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        // if there are any elements to send
        std::vector<size_t> send_counts(comm.size(), 0);
        blk_dist part(total_size, comm);
        if (local_size > 0) {
          int first_p = part.rank_of(prefix);
          size_t left_to_send = local_size;
          for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
              size_t nsend = std::min<size_t>(part.iprefix_size(first_p) - prefix, left_to_send);
              send_counts[first_p] = nsend;
              left_to_send -= nsend;
              prefix += nsend;
          }
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        using SendType = typename std::iterator_traits<_InIterator>::value_type;
        using RecvType = typename std::iterator_traits<_OutIterator>::value_type;
        const SendType* send_buf = (local_size > 0) ? &(*begin) : nullptr;
        RecvType* recv_buf = (part.local_size() > 0) ? &(*out) : nullptr;
        mxx::all2allv(send_buf, send_counts, recv_buf, recv_counts, comm);
    }
}